

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runner.h
# Opt level: O2

void bandit::use_default_colorizers(choice_options *choices)

{
  allocator local_89;
  string local_88;
  _Any_data local_68;
  code *local_58;
  code *local_50;
  _Any_data local_48;
  code *local_38;
  code *local_30;
  _Any_data local_28;
  code *local_18;
  code *local_10;
  
  std::__cxx11::string::string((string *)&local_88,"off",&local_89);
  local_28._M_unused._M_object = (void *)0x0;
  local_28._8_8_ = 0;
  local_10 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:43:35)>
             ::_M_invoke;
  local_18 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:43:35)>
             ::_M_manager;
  detail::option_map::add(&choices->colorizers,&local_88,(controller_func_t *)&local_28,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_28);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"dark",&local_89);
  local_48._M_unused._M_object = (void *)0x0;
  local_48._8_8_ = 0;
  local_30 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:46:36)>
             ::_M_invoke;
  local_38 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:46:36)>
             ::_M_manager;
  detail::option_map::add(&choices->colorizers,&local_88,(controller_func_t *)&local_48,false);
  std::_Function_base::~_Function_base((_Function_base *)&local_48);
  std::__cxx11::string::~string((string *)&local_88);
  std::__cxx11::string::string((string *)&local_88,"light",&local_89);
  local_68._M_unused._M_object = (void *)0x0;
  local_68._8_8_ = 0;
  local_50 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:49:37)>
             ::_M_invoke;
  local_58 = std::
             _Function_handler<void_(bandit::detail::controller_t_&),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/findNextStep[P]fileWatcher/3rdparty/bandit/runner.h:49:37)>
             ::_M_manager;
  detail::option_map::add(&choices->colorizers,&local_88,(controller_func_t *)&local_68,true);
  std::_Function_base::~_Function_base((_Function_base *)&local_68);
  std::__cxx11::string::~string((string *)&local_88);
  return;
}

Assistant:

inline void use_default_colorizers(detail::choice_options& choices) {
    choices.colorizers.add("off", [&](detail::controller_t& controller) {
      controller.set_colorizer(new colorizer::off());
    });
    choices.colorizers.add("dark", [&](detail::controller_t& controller) {
      controller.set_colorizer(new colorizer::dark());
    });
    choices.colorizers.add("light", [&](detail::controller_t& controller) {
      controller.set_colorizer(new colorizer::light());
    }, true);
  }